

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<unsigned_char>_> *
kj::decodeBase64(EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,
                ArrayPtr<const_char> input)

{
  int iVar1;
  size_t sVar2;
  char *code_in;
  uchar *puVar3;
  size_t sVar4;
  uchar *__src;
  Array<unsigned_char> *pAVar5;
  undefined1 local_80 [8];
  Array<unsigned_char> copy;
  size_t n;
  Array<unsigned_char> output;
  base64_decodestate state;
  ArrayPtr<const_char> input_local;
  
  state._16_8_ = input.ptr;
  anon_unknown_0::base64_decodestate::base64_decodestate((base64_decodestate *)&output.disposer);
  sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&state.step);
  heapArray<unsigned_char>((Array<unsigned_char> *)&n,sVar2 * 6 + 7 >> 3);
  code_in = ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&state.step);
  sVar2 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&state.step);
  puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)&n);
  iVar1 = anon_unknown_0::base64_decode_block
                    (code_in,(int)sVar2,(char *)puVar3,(base64_decodestate *)&output.disposer);
  sVar2 = (size_t)iVar1;
  sVar4 = Array<unsigned_char>::size((Array<unsigned_char> *)&n);
  if (sVar2 < sVar4) {
    heapArray<unsigned_char>((Array<unsigned_char> *)local_80,sVar2);
    puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_80);
    __src = Array<unsigned_char>::begin((Array<unsigned_char> *)&n);
    memcpy(puVar3,__src,sVar2);
    pAVar5 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_80);
    Array<unsigned_char>::operator=((Array<unsigned_char> *)&n,pAVar5);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_80);
  }
  pAVar5 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&n);
  EncodingResult<kj::Array<unsigned_char>_>::EncodingResult
            (__return_storage_ptr__,pAVar5,(bool)((byte)output.disposer & 1));
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&n);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBase64(ArrayPtr<const char> input) {
  base64_decodestate state;

  auto output = heapArray<byte>((input.size() * 6 + 7) / 8);

  size_t n = base64_decode_block(input.begin(), input.size(),
      reinterpret_cast<char*>(output.begin()), &state);

  if (n < output.size()) {
    auto copy = heapArray<byte>(n);
    memcpy(copy.begin(), output.begin(), n);
    output = kj::mv(copy);
  }

  return EncodingResult<Array<byte>>(kj::mv(output), state.hadErrors);
}